

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_wrpkru_x86_64(CPUX86State *env,uint32_t ecx,uint64_t val)

{
  CPUState *cpu;
  uintptr_t unaff_retaddr;
  CPUState *cs;
  uint64_t val_local;
  uint32_t ecx_local;
  CPUX86State *env_local;
  
  cpu = env_cpu(env);
  if ((env->cr[4] & 0x400000) == 0) {
    raise_exception_err_ra_x86_64(env,6,0,unaff_retaddr);
  }
  if ((ecx == 0) && ((val & 0xffffffff00000000) == 0)) {
    env->pkru = (uint32_t)val;
    tlb_flush_x86_64(cpu);
    return;
  }
  raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
}

Assistant:

void helper_wrpkru(CPUX86State *env, uint32_t ecx, uint64_t val)
{
    CPUState *cs = env_cpu(env);

    if ((env->cr[4] & CR4_PKE_MASK) == 0) {
        raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
    }
    if (ecx != 0 || (val & 0xFFFFFFFF00000000ull)) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }

    env->pkru = val;
    tlb_flush(cs);
}